

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

int Wlc_NtkDcFlopNum(Wlc_Ntk_t *p)

{
  char *__s;
  size_t sVar1;
  ulong uVar2;
  int iVar3;
  
  __s = p->pInits;
  iVar3 = 0;
  if (__s != (char *)0x0) {
    sVar1 = strlen(__s);
    iVar3 = 0;
    if (0 < (int)(uint)sVar1) {
      uVar2 = 0;
      iVar3 = 0;
      do {
        iVar3 = iVar3 + (uint)((__s[uVar2] & 0xdfU) == 0x58);
        uVar2 = uVar2 + 1;
      } while (((uint)sVar1 & 0x7fffffff) != uVar2);
    }
  }
  return iVar3;
}

Assistant:

int Wlc_NtkDcFlopNum( Wlc_Ntk_t * p )
{
    int i, nFlops, Count = 0;
    if ( p->pInits == NULL )
        return 0;
    nFlops = strlen(p->pInits);
    for ( i = 0; i < nFlops; i++ )
        Count += (p->pInits[i] == 'x' || p->pInits[i] == 'X');
    return Count;
}